

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O3

void __thiscall trial::protocol::json::example::pretty_printer::print(pretty_printer *this)

{
  value vVar1;
  error *this_00;
  error_code eVar2;
  error_code ec;
  error_code ec_00;
  view_type local_20;
  
  vVar1 = symbol(this);
  switch(vVar1) {
  case begin_array:
    print_array(this,false);
    break;
  case end_array:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    eVar2 = make_error_code(unbalanced_end_array);
    ec_00._M_cat = eVar2._M_cat;
    ec_00._4_4_ = 0;
    ec_00._M_value = eVar2._M_value;
    error::error(this_00,ec_00);
    goto LAB_00103b3f;
  case begin_object:
    print_object(this,false);
    break;
  case end_object:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    eVar2 = make_error_code(unbalanced_end_object);
    ec._M_cat = eVar2._M_cat;
    ec._4_4_ = 0;
    ec._M_value = eVar2._M_value;
    error::error(this_00,ec);
LAB_00103b3f:
    __cxa_throw(this_00,&error::typeinfo,std::system_error::~system_error);
  default:
    print_value(this);
  }
  local_20._M_len = 1;
  local_20._M_str = "\n";
  basic_writer<char,_16UL>::literal(this->writer,&local_20);
  return;
}

Assistant:

void print()
    {
        // Print outer scope
        switch (symbol())
        {
        case json::token::symbol::begin_array:
            print_array(false);
            break;

        case json::token::symbol::end_array:
            throw json::error(make_error_code(json::unbalanced_end_array));

        case json::token::symbol::begin_object:
            print_object(false);
            break;

        case json::token::symbol::end_object:
            throw json::error(make_error_code(json::unbalanced_end_object));

        default:
            print_value();
            break;
        }
        newline();
    }